

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

bool peparse::readRichHeader(bounded_buffer *rich_buf,uint32_t key,rich_header *rich_hdr)

{
  bool bVar1;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  uint32_t offset;
  uint32_t encrypted_dword;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  rich_entry entry;
  
  if (rich_buf != (bounded_buffer *)0x0) {
    bVar1 = readDword(rich_buf,0,&encrypted_dword);
    if (bVar1) {
      if ((encrypted_dword ^ key) != 0x536e6144) {
        rich_hdr->isPresent = false;
        return false;
      }
      rich_hdr->isPresent = true;
      rich_hdr->StartSignature = 0x536e6144;
      for (offset = 0x10; offset < rich_buf->bufLen - 8; offset = offset + 8) {
        bVar1 = readDword(rich_buf,offset,&encrypted_dword);
        if (!bVar1) {
          err = 6;
          std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
          to_string<unsigned_int>(&local_58,0x4f8,f_00);
          std::operator+(&local_78,":",&local_58);
          std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
          goto LAB_001145b5;
        }
        entry._0_4_ = (encrypted_dword ^ key) >> 0x10 | (encrypted_dword ^ key) << 0x10;
        bVar1 = readDword(rich_buf,offset + 4,&encrypted_dword);
        if (!bVar1) {
          err = 6;
          std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
          to_string<unsigned_int>(&local_58,0x503,f_01);
          std::operator+(&local_78,":",&local_58);
          std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
          goto LAB_001145b5;
        }
        entry.Count = encrypted_dword ^ key;
        std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>::push_back
                  (&rich_hdr->Entries,&entry);
      }
      bVar1 = readDword(rich_buf,rich_buf->bufLen - 4,&rich_hdr->EndSignature);
      if (bVar1) {
        if (rich_hdr->EndSignature == 0x68636952) {
          rich_hdr->DecryptionKey = key;
          return true;
        }
        err = 9;
        std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
        to_string<unsigned_int>(&local_58,0x514,f_03);
        std::operator+(&local_78,":",&local_58);
        std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
      }
      else {
        err = 6;
        std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
        to_string<unsigned_int>(&local_58,0x510,f_02);
        std::operator+(&local_78,":",&local_58);
        std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
      }
    }
    else {
      err = 6;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_58,0x4de,f);
      std::operator+(&local_78,":",&local_58);
      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
    }
LAB_001145b5:
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return false;
}

Assistant:

bool readRichHeader(bounded_buffer *rich_buf,
                    std::uint32_t key,
                    rich_header &rich_hdr) {
  if (rich_buf == nullptr) {
    return false;
  }

  std::uint32_t encrypted_dword;
  std::uint32_t decrypted_dword;

  // Confirm DanS signature exists first.
  // The first decrypted DWORD value of the rich header
  // at offset 0 should be 0x536e6144 aka the "DanS" signature
  if (!readDword(rich_buf, 0, encrypted_dword)) {
    PE_ERR(PEERR_READ);
    return false;
  }

  decrypted_dword = encrypted_dword ^ key;

  if (decrypted_dword == RICH_MAGIC_START) {
    // DanS magic found
    rich_hdr.isPresent = true;
    rich_hdr.StartSignature = decrypted_dword;
  } else {
    // DanS magic not found
    rich_hdr.isPresent = false;
    return false;
  }

  // Iterate over the remaining entries.
  // Start from buffer offset 16 because after "DanS" there
  // are three DWORDs of zero padding that can be skipped over.
  // a DWORD is 4 bytes. Loop is incrementing 8 bytes, however
  // we are reading two DWORDS at a time, which is the size
  // of one rich header entry.
  for (std::uint32_t i = 16; i < rich_buf->bufLen - 8; i += 8) {
    rich_entry entry;
    // Read first DWORD of entry and decrypt it
    if (!readDword(rich_buf, i, encrypted_dword)) {
      PE_ERR(PEERR_READ);
      return false;
    }
    decrypted_dword = encrypted_dword ^ key;
    // The high WORD of the first DWORD is the Product ID
    entry.ProductId = (decrypted_dword & 0xFFFF0000) >> 16;
    // The low WORD of the first DWORD is the Build Number
    entry.BuildNumber = (decrypted_dword & 0xFFFF);

    // The second DWORD represents the use count
    if (!readDword(rich_buf, i + 4, encrypted_dword)) {
      PE_ERR(PEERR_READ);
      return false;
    }
    decrypted_dword = encrypted_dword ^ key;
    // The full 32-bit DWORD is the count
    entry.Count = decrypted_dword;

    // Preserve the individual entry
    rich_hdr.Entries.push_back(entry);
  }

  // Preserve the end signature aka "Rich" magic
  if (!readDword(rich_buf, rich_buf->bufLen - 4, rich_hdr.EndSignature)) {
    PE_ERR(PEERR_READ);
    return false;
  };
  if (rich_hdr.EndSignature != RICH_MAGIC_END) {
    PE_ERR(PEERR_MAGIC);
    return false;
  }

  // Preserve the decryption key
  rich_hdr.DecryptionKey = key;

  return true;
}